

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieanimation_capi.cpp
# Opt level: O3

LOTMarkerList * lottie_animation_get_markerlist(Lottie_Animation_S *animation)

{
  undefined1 auVar1 [16];
  MarkerList *__x;
  LOTMarkerList *pLVar2;
  LOTMarker *__s;
  char *pcVar3;
  ulong __n;
  ulong uVar4;
  long lVar5;
  size_t *psVar6;
  MarkerList markers;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  local_40;
  
  if (animation == (Lottie_Animation_S *)0x0) {
    pLVar2 = (LOTMarkerList *)0x0;
  }
  else {
    __x = rlottie::Animation::markers_abi_cxx11_
                    ((animation->mAnimation)._M_t.
                     super___uniq_ptr_impl<rlottie::Animation,_std::default_delete<rlottie::Animation>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_rlottie::Animation_*,_std::default_delete<rlottie::Animation>_>
                     .super__Head_base<0UL,_rlottie::Animation_*,_false>._M_head_impl);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
    ::vector(&local_40,__x);
    if ((long)local_40.
              super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_40.
              super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0) {
      pLVar2 = (LOTMarkerList *)0x0;
    }
    else {
      pLVar2 = animation->mMarkerList;
      if (pLVar2 == (LOTMarkerList *)0x0) {
        uVar4 = ((long)local_40.
                       super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_40.
                       super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
        pLVar2 = (LOTMarkerList *)operator_new(0x10);
        animation->mMarkerList = pLVar2;
        pLVar2->size = uVar4;
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar4;
        __n = 0xffffffffffffffff;
        if (SUB168(auVar1 * ZEXT816(0x18),8) == 0) {
          __n = SUB168(auVar1 * ZEXT816(0x18),0);
        }
        __s = (LOTMarker *)operator_new__(__n);
        memset(__s,0,__n);
        pLVar2->ptr = __s;
        lVar5 = uVar4 + (uVar4 == 0);
        psVar6 = &__s->endframe;
        do {
          pcVar3 = strdup(((local_40.
                            super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                          ).
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                          ._M_head_impl._M_dataplus._M_p);
          ((LOTMarker *)(psVar6 + -2))->name = pcVar3;
          psVar6[-1] = (long)((local_40.
                               super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                             ).super__Tuple_impl<1UL,_int,_int>.super__Head_base<1UL,_int,_false>.
                             _M_head_impl;
          *psVar6 = (long)((local_40.
                            super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                          ).super__Tuple_impl<1UL,_int,_int>.super__Tuple_impl<2UL,_int>.
                          super__Head_base<2UL,_int,_false>._M_head_impl;
          psVar6 = psVar6 + 3;
          local_40.
          super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               local_40.
               super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1;
          lVar5 = lVar5 + -1;
        } while (lVar5 != 0);
      }
    }
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
    ::~vector(&local_40);
  }
  return pLVar2;
}

Assistant:

RLOTTIE_API const LOTMarkerList*
lottie_animation_get_markerlist(Lottie_Animation_S *animation)
{
   if (!animation) return nullptr;

   auto markers = animation->mAnimation->markers();
   if (markers.size() == 0) return nullptr;
   if (animation->mMarkerList) return (const LOTMarkerList*)animation->mMarkerList;

   animation->mMarkerList = new LOTMarkerList();
   animation->mMarkerList->size = markers.size();
   animation->mMarkerList->ptr = new LOTMarker[markers.size()]();

   for(size_t i = 0; i < markers.size(); i++) {
       animation->mMarkerList->ptr[i].name = strdup(std::get<0>(markers[i]).c_str());
       animation->mMarkerList->ptr[i].startframe= std::get<1>(markers[i]);
       animation->mMarkerList->ptr[i].endframe= std::get<2>(markers[i]);
   }
   return (const LOTMarkerList*)animation->mMarkerList;
}